

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int ilog(int32 n)

{
  int32 n_local;
  int local_4;
  
  if (n < 0) {
    local_4 = 0;
  }
  else if (n < 0x4000) {
    if (n < 0x10) {
      local_4 = (int)ilog::log2_4[n];
    }
    else if (n < 0x200) {
      local_4 = ilog::log2_4[n >> 5] + 5;
    }
    else {
      local_4 = ilog::log2_4[n >> 10] + 10;
    }
  }
  else if (n < 0x1000000) {
    if (n < 0x80000) {
      local_4 = ilog::log2_4[n >> 0xf] + 0xf;
    }
    else {
      local_4 = ilog::log2_4[n >> 0x14] + 0x14;
    }
  }
  else if (n < 0x20000000) {
    local_4 = ilog::log2_4[n >> 0x19] + 0x19;
  }
  else {
    local_4 = ilog::log2_4[n >> 0x1e] + 0x1e;
  }
  return local_4;
}

Assistant:

static int ilog(int32 n)
{
   static signed char log2_4[16] = { 0,1,2,2,3,3,3,3,4,4,4,4,4,4,4,4 };

   if (n < 0) return 0; // signed n returns 0

   // 2 compares if n < 16, 3 compares otherwise (4 if signed or n > 1<<29)
   if (n < (1 << 14))
        if (n < (1 <<  4))            return  0 + log2_4[n      ];
        else if (n < (1 <<  9))       return  5 + log2_4[n >>  5];
             else                     return 10 + log2_4[n >> 10];
   else if (n < (1 << 24))
             if (n < (1 << 19))       return 15 + log2_4[n >> 15];
             else                     return 20 + log2_4[n >> 20];
        else if (n < (1 << 29))       return 25 + log2_4[n >> 25];
             else                     return 30 + log2_4[n >> 30];
}